

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_214010::CAPIBuildSystemFrontendDelegate::determinedRuleNeedsToRun
          (CAPIBuildSystemFrontendDelegate *this,Rule *ruleNeedingToRun,RunReason reason,
          Rule *inputRule)

{
  CAPIBuildKey *this_00;
  CAPIBuildKey *this_01;
  BuildKey key;
  BuildKey inputKey;
  
  if ((this->cAPIDelegate).determined_rule_needs_to_run !=
      (_func_void_void_ptr_llb_build_key_t_ptr_llb_rule_run_reason_t_llb_build_key_t_ptr *)0x0) {
    llbuild::buildsystem::BuildKey::fromData(&key,&ruleNeedingToRun->key);
    this_00 = (CAPIBuildKey *)operator_new(0x38);
    CAPIBuildKey::CAPIBuildKey(this_00,&key);
    if (inputRule == (Rule *)0x0) {
      this_01 = (CAPIBuildKey *)0x0;
    }
    else {
      llbuild::buildsystem::BuildKey::fromData(&inputKey,&inputRule->key);
      this_01 = (CAPIBuildKey *)operator_new(0x38);
      CAPIBuildKey::CAPIBuildKey(this_01,&inputKey);
      std::__cxx11::string::_M_dispose();
    }
    if (Forced < reason) {
      __assert_fail("0 && \"unknown reason\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                    ,0x1ef,
                    "static llb_rule_run_reason_t (anonymous namespace)::CAPIBuildSystemFrontendDelegate::convertRunReason(core::Rule::RunReason)"
                   );
    }
    (*(this->cAPIDelegate).determined_rule_needs_to_run)
              ((this->cAPIDelegate).context,(llb_build_key_t *)this_00,reason,
               (llb_build_key_t *)this_01);
    llb_build_key_destroy((llb_build_key_t *)this_00);
    if (this_01 != (CAPIBuildKey *)0x0) {
      llb_build_key_destroy((llb_build_key_t *)this_01);
    }
    std::__cxx11::string::_M_dispose();
  }
  return;
}

Assistant:

virtual void determinedRuleNeedsToRun(core::Rule* ruleNeedingToRun, core::Rule::RunReason reason, core::Rule* inputRule) override {
    if (cAPIDelegate.determined_rule_needs_to_run) {
      auto key = BuildKey::fromData(ruleNeedingToRun->key);
      auto needsToRun = (llb_build_key_t *)new CAPIBuildKey(key);
      llb_build_key_t * input;
      if (inputRule) {
        auto inputKey = BuildKey::fromData(inputRule->key);
        input = (llb_build_key_t *)new CAPIBuildKey(inputKey);
      } else {
        input = nullptr;
      }
      cAPIDelegate.determined_rule_needs_to_run(cAPIDelegate.context, needsToRun, convertRunReason(reason), input);
      llb_build_key_destroy(needsToRun);
      if (input) {
        llb_build_key_destroy(input);
      }
    }
  }